

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnfFast.c
# Opt level: O1

void Cnf_CollectLeaves_rec(Aig_Obj_t *pRoot,Aig_Obj_t *pObj,Vec_Ptr_t *vSuper,int fStopCompl)

{
  uint uVar1;
  uint uVar2;
  void **ppvVar3;
  long lVar4;
  int iVar5;
  Aig_Obj_t *pAVar6;
  
  while ((pRoot == pObj ||
         (((pObj->field_0x18 & 0x10) == 0 && ((fStopCompl == 0 || (((ulong)pObj & 1) == 0))))))) {
    if ((*(uint *)&pObj->field_0x18 & 7) - 7 < 0xfffffffe) {
      __assert_fail("Aig_ObjIsNode(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/cnf/cnfFast.c"
                    ,0x34,"void Cnf_CollectLeaves_rec(Aig_Obj_t *, Aig_Obj_t *, Vec_Ptr_t *, int)");
    }
    if (fStopCompl == 0) {
      fStopCompl = 0;
      Cnf_CollectLeaves_rec(pRoot,(Aig_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe),vSuper,0)
      ;
      pObj = (Aig_Obj_t *)((ulong)pObj->pFanin1 & 0xfffffffffffffffe);
    }
    else {
      fStopCompl = 1;
      Cnf_CollectLeaves_rec(pRoot,pObj->pFanin0,vSuper,1);
      pObj = pObj->pFanin1;
    }
  }
  pAVar6 = (Aig_Obj_t *)((ulong)pObj & 0xfffffffffffffffe);
  if (fStopCompl != 0) {
    pAVar6 = pObj;
  }
  uVar1 = vSuper->nSize;
  if (0 < (long)(int)uVar1) {
    lVar4 = 0;
    do {
      if ((Aig_Obj_t *)vSuper->pArray[lVar4] == pAVar6) {
        return;
      }
      lVar4 = lVar4 + 1;
    } while ((int)uVar1 != lVar4);
  }
  uVar2 = vSuper->nCap;
  if (uVar1 == uVar2) {
    if ((int)uVar2 < 0x10) {
      if (vSuper->pArray == (void **)0x0) {
        ppvVar3 = (void **)malloc(0x80);
      }
      else {
        ppvVar3 = (void **)realloc(vSuper->pArray,0x80);
      }
      vSuper->pArray = ppvVar3;
      iVar5 = 0x10;
    }
    else {
      iVar5 = uVar2 * 2;
      if (iVar5 <= (int)uVar2) goto LAB_00551cc9;
      if (vSuper->pArray == (void **)0x0) {
        ppvVar3 = (void **)malloc((ulong)uVar2 << 4);
      }
      else {
        ppvVar3 = (void **)realloc(vSuper->pArray,(ulong)uVar2 << 4);
      }
      vSuper->pArray = ppvVar3;
    }
    vSuper->nCap = iVar5;
  }
LAB_00551cc9:
  iVar5 = vSuper->nSize;
  vSuper->nSize = iVar5 + 1;
  vSuper->pArray[iVar5] = pAVar6;
  return;
}

Assistant:

ABC_NAMESPACE_IMPL_START

////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Detects multi-input gate rooted at this node.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Cnf_CollectLeaves_rec( Aig_Obj_t * pRoot, Aig_Obj_t * pObj, Vec_Ptr_t * vSuper, int fStopCompl )
{
    if ( pRoot != pObj && (pObj->fMarkA || (fStopCompl && Aig_IsComplement(pObj))) )
    {
        Vec_PtrPushUnique( vSuper, fStopCompl ? pObj : Aig_Regular(pObj) );
        return;
    }
    assert( Aig_ObjIsNode(pObj) );
    if ( fStopCompl )
    {
        Cnf_CollectLeaves_rec( pRoot, Aig_ObjChild0(pObj), vSuper, 1 );
        Cnf_CollectLeaves_rec( pRoot, Aig_ObjChild1(pObj), vSuper, 1 );
    }
    else
    {
        Cnf_CollectLeaves_rec( pRoot, Aig_ObjFanin0(pObj), vSuper, 0 );
        Cnf_CollectLeaves_rec( pRoot, Aig_ObjFanin1(pObj), vSuper, 0 );
    }
}